

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

sample * __thiscall
Catch::Benchmark::Detail::
jackknife<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>
          (sample *__return_storage_ptr__,Detail *this,
          _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator,iterator first,iterator last)

{
  code *pcVar1;
  bool bVar2;
  undefined8 local_80;
  undefined8 local_78;
  value_type_conflict4 local_70;
  double *local_68;
  double *local_60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  iterator it;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  iterator second;
  size_t n;
  _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
  **estimator_local;
  iterator last_local;
  iterator first_local;
  sample *results;
  
  estimator_local =
       (_func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
        **)first._M_current;
  last_local._M_current = (double *)estimator;
  second._M_current =
       (double *)
       __gnu_cxx::operator-
                 ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  &estimator_local,&last_local);
  local_38._M_current = last_local._M_current;
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator++
            (&local_38);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  std::vector<double,_std::allocator<double>_>::reserve
            (__return_storage_ptr__,(size_type)second._M_current);
  local_58._M_current = last_local._M_current;
  while (bVar2 = __gnu_cxx::operator!=
                           (&local_58,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&estimator_local), bVar2) {
    local_60 = local_58._M_current;
    local_68 = last_local._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (local_58,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        last_local._M_current);
    pcVar1 = *(code **)this;
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_78,&local_38);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_80,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               &estimator_local);
    local_70 = (value_type_conflict4)(*pcVar1)(local_78,local_80);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_70);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

sample jackknife(Estimator&& estimator,
                             std::vector<double>::iterator first,
                             std::vector<double>::iterator last) {
                auto n = static_cast<size_t>(last - first);
                auto second = first;
                ++second;
                sample results;
                results.reserve(n);

                for (auto it = first; it != last; ++it) {
                    std::iter_swap(it, first);
                    results.push_back(estimator(second, last));
                }

                return results;
            }